

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

void fdb_file_handle_init(fdb_file_handle *fhandle,fdb_kvs_handle *root)

{
  list *plVar1;
  
  fhandle->root = root;
  fhandle->flags = 0;
  root->fhandle = fhandle;
  plVar1 = (list *)calloc(1,0x10);
  fhandle->handles = plVar1;
  fhandle->cmp_func_list = (list *)0x0;
  pthread_spin_init(&fhandle->lock,1);
  return;
}

Assistant:

void fdb_file_handle_init(fdb_file_handle *fhandle,
                           fdb_kvs_handle *root)
{
    fhandle->root = root;
    fhandle->flags = 0x0;
    root->fhandle = fhandle;
    fhandle->handles = (struct list*)calloc(1, sizeof(struct list));
    fhandle->cmp_func_list = NULL;
    spin_init(&fhandle->lock);
}